

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# smb.c
# Opt level: O0

CURLcode smb_recv_message(connectdata *conn,void **msg)

{
  unsigned_short uVar1;
  ulong uVar2;
  long lVar3;
  long lVar4;
  CURLcode result;
  size_t len;
  size_t msg_size;
  size_t nbt_size;
  ssize_t bytes_read;
  char *buf;
  smb_conn *smbc;
  void **msg_local;
  connectdata *conn_local;
  
  buf = (char *)&conn->proto;
  bytes_read = (conn->proto).ftpc.pp.sendleft;
  smbc = (smb_conn *)msg;
  msg_local = &conn->data;
  conn_local._4_4_ =
       Curl_read(conn,0,(char *)(bytes_read + (conn->proto).ftpc.pp.response_time),
                 0x9000 - (conn->proto).smbc.got,(ssize_t *)&nbt_size);
  if (conn_local._4_4_ == CURLE_OK) {
    if (nbt_size == 0) {
      conn_local._4_4_ = CURLE_OK;
    }
    else {
      *(size_t *)(buf + 0x50) = nbt_size + *(long *)(buf + 0x50);
      if (*(ulong *)(buf + 0x50) < 4) {
        conn_local._4_4_ = CURLE_OK;
      }
      else {
        uVar1 = Curl_read16_be((uchar *)(bytes_read + 2));
        uVar2 = (ulong)uVar1 + 4;
        if (*(ulong *)(buf + 0x50) < uVar2) {
          conn_local._4_4_ = CURLE_OK;
        }
        else if (((uVar2 < 0x25) ||
                 (lVar3 = (ulong)*(byte *)(bytes_read + 0x24) * 2, lVar4 = lVar3 + 0x25,
                 uVar2 < lVar3 + 0x27U)) ||
                (uVar1 = Curl_read16_le((uchar *)(bytes_read + lVar4)),
                (ulong)uVar1 + 2 + lVar4 <= uVar2)) {
          *(ssize_t *)smbc = bytes_read;
          conn_local._4_4_ = CURLE_OK;
        }
        else {
          conn_local._4_4_ = CURLE_READ_ERROR;
        }
      }
    }
  }
  return conn_local._4_4_;
}

Assistant:

static CURLcode smb_recv_message(struct connectdata *conn, void **msg)
{
  struct smb_conn *smbc = &conn->proto.smbc;
  char *buf = smbc->recv_buf;
  ssize_t bytes_read;
  size_t nbt_size;
  size_t msg_size;
  size_t len = MAX_MESSAGE_SIZE - smbc->got;
  CURLcode result;

  result = Curl_read(conn, FIRSTSOCKET, buf + smbc->got, len, &bytes_read);
  if(result)
    return result;

  if(!bytes_read)
    return CURLE_OK;

  smbc->got += bytes_read;

  /* Check for a 32-bit nbt header */
  if(smbc->got < sizeof(unsigned int))
    return CURLE_OK;

  nbt_size = Curl_read16_be((const unsigned char *)
                            (buf + sizeof(unsigned short))) +
    sizeof(unsigned int);
  if(smbc->got < nbt_size)
    return CURLE_OK;

  msg_size = sizeof(struct smb_header);
  if(nbt_size >= msg_size + 1) {
    /* Add the word count */
    msg_size += 1 + ((unsigned char) buf[msg_size]) * sizeof(unsigned short);
    if(nbt_size >= msg_size + sizeof(unsigned short)) {
      /* Add the byte count */
      msg_size += sizeof(unsigned short) +
        Curl_read16_le((const unsigned char *)&buf[msg_size]);
      if(nbt_size < msg_size)
        return CURLE_READ_ERROR;
    }
  }

  *msg = buf;

  return CURLE_OK;
}